

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O3

void __thiscall TPZAcademicGeoMesh::CheckConsistency(TPZAcademicGeoMesh *this,TPZGeoMesh *mesh)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  TPZGeoEl **ppTVar5;
  int i;
  TPZGeoEl *pTVar6;
  long lVar7;
  TPZGeoEl *pTVar8;
  undefined **ppuVar9;
  int iVar10;
  TPZGeoEl *pTVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  TPZGeoElSide gelside;
  TPZFNMatrix<6,_double> axes;
  TPZManVector<double,_3> normal;
  REAL detjac;
  TPZFNMatrix<4,_double> jacinv;
  TPZFNMatrix<4,_double> jac;
  TPZManVector<double,_3> x;
  TPZGeoElSide local_3a0;
  TPZChunkVector<TPZGeoEl_*,_10> *local_388;
  pointer_____offset_0x18___ *local_380;
  TPZVec<double> local_378;
  double adStack_358 [2];
  TPZFMatrix<double> local_348;
  double local_2b8 [7];
  long local_280;
  int64_t local_278;
  _func_int **local_270;
  _func_int **local_268;
  double *local_260;
  _func_int **local_258;
  _func_int **local_250;
  undefined **local_248;
  double *local_240;
  _func_int **local_238;
  double *local_230;
  _func_int **local_228;
  TPZGeoEl *local_220;
  TPZManVector<double,_3> local_218;
  REAL local_1e0;
  TPZFMatrix<double> local_1d8;
  double adStack_148 [5];
  TPZFMatrix<double> local_120;
  double adStack_90 [5];
  TPZManVector<double,_3> local_68;
  
  local_280 = (mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < local_280) {
    local_388 = &(mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
    local_230 = local_2b8;
    local_240 = adStack_90;
    local_260 = adStack_148;
    ppuVar9 = &PTR__TPZGeoElSide_018f8760;
    local_228 = (_func_int **)&PTR__TPZManVector_0181c090;
    local_238 = (_func_int **)&PTR__TPZFMatrix_01883a30;
    local_250 = (_func_int **)&PTR__TPZFNMatrix_01883740;
    local_258 = (_func_int **)&PTR__TPZFMatrix_01878f70;
    local_380 = &PTR_PTR_018839f8;
    local_278 = 0;
    local_248 = &PTR__TPZManVector_01815498;
    local_268 = (_func_int **)&PTR__TPZFNMatrix_01878c80;
    local_270 = (_func_int **)&PTR__TPZGeoElSide_018f8760;
    do {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_388,local_278);
      pTVar11 = *ppTVar5;
      iVar3 = (**(code **)(*(long *)pTVar11 + 0xf0))(pTVar11);
      if (0 < iVar3) {
        iVar10 = 0;
        local_220 = pTVar11;
        do {
          local_3a0.super_TPZSavable._vptr_TPZSavable = (_func_int **)ppuVar9;
          local_3a0.fGeoEl = pTVar11;
          local_3a0.fSide = iVar10;
          iVar4 = TPZGeoElSide::Dimension(&local_3a0);
          if (iVar4 == 2) {
            if (local_3a0.fGeoEl == (TPZGeoEl *)0x0) {
              iVar4 = -1;
              pTVar6 = (TPZGeoEl *)0x0;
              pTVar8 = (TPZGeoEl *)0x0;
            }
            else {
              (**(code **)(*(long *)local_3a0.fGeoEl + 0x188))
                        (&local_348,local_3a0.fGeoEl,local_3a0.fSide);
              pTVar6 = local_3a0.fGeoEl;
              pTVar8 = (TPZGeoEl *)local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
              iVar4 = (int)local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
            }
            if ((pTVar8 == pTVar6) && (iVar4 == local_3a0.fSide)) {
              TPZVec<double>::TPZVec(&local_378,0);
              local_378._vptr_TPZVec = local_228;
              local_378.fStore = adStack_358;
              local_378.fNElements = 2;
              local_378.fNAlloc = 0;
              adStack_358[0] = 0.0;
              adStack_358[1] = 0.0;
              TPZGeoElSide::CenterPoint(&local_3a0,&local_378);
              local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
              local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
              local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
              local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
              local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_238;
              local_348.fElem = local_230;
              local_348.fGiven = local_230;
              local_348.fSize = 6;
              TPZVec<int>::TPZVec(&local_348.fPivot.super_TPZVec<int>,0);
              pp_Var2 = local_258;
              local_348.fPivot.super_TPZVec<int>._vptr_TPZVec =
                   (_func_int **)&PTR__TPZManVector_01815498;
              local_348.fPivot.super_TPZVec<int>.fStore = local_348.fPivot.fExtAlloc;
              local_348.fPivot.super_TPZVec<int>.fNElements = 0;
              local_348.fPivot.super_TPZVec<int>.fNAlloc = 0;
              local_348.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
              local_348.fWork.fStore = (double *)0x0;
              local_348.fWork.fNElements = 0;
              local_348.fWork.fNAlloc = 0;
              local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_250;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_258;
              local_120.fElem = local_240;
              local_120.fGiven = local_240;
              local_120.fSize = 4;
              TPZVec<int>::TPZVec(&local_120.fPivot.super_TPZVec<int>,0);
              pp_Var1 = local_268;
              local_120.fPivot.super_TPZVec<int>._vptr_TPZVec =
                   (_func_int **)&PTR__TPZManVector_01815498;
              local_120.fPivot.super_TPZVec<int>.fStore = local_120.fPivot.fExtAlloc;
              local_120.fPivot.super_TPZVec<int>.fNElements = 0;
              local_120.fPivot.super_TPZVec<int>.fNAlloc = 0;
              local_120.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
              local_120.fWork.fStore = (double *)0x0;
              local_120.fWork.fNElements = 0;
              local_120.fWork.fNAlloc = 0;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_268;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = pp_Var2;
              local_1d8.fElem = local_260;
              local_1d8.fGiven = local_260;
              local_1d8.fSize = 4;
              TPZVec<int>::TPZVec(&local_1d8.fPivot.super_TPZVec<int>,0);
              local_1d8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                   (_func_int **)&PTR__TPZManVector_01815498;
              local_1d8.fPivot.super_TPZVec<int>.fStore = local_1d8.fPivot.fExtAlloc;
              local_1d8.fPivot.super_TPZVec<int>.fNElements = 0;
              local_1d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
              local_1d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
              local_1d8.fWork.fStore = (double *)0x0;
              local_1d8.fWork.fNElements = 0;
              local_1d8.fWork.fNAlloc = 0;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = pp_Var1;
              TPZGeoElSide::Jacobian
                        (&local_3a0,&local_378,&local_120,&local_348,&local_1e0,&local_1d8);
              local_218.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
              TPZManVector<double,_3>::TPZManVector(&local_68,3,(double *)&local_218);
              ppuVar9 = local_270;
              TPZGeoElSide::X(&local_3a0,&local_378,&local_68.super_TPZVec<double>);
              TPZManVector<double,_3>::TPZManVector(&local_218,3);
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2 ||
                  local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *local_218.super_TPZVec<double>.fStore =
                   ABS(local_348.fElem[local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] *
                       local_348.fElem
                       [local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] -
                       local_348.fElem
                       [local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] *
                       local_348.fElem
                       [(long)(local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1)]);
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1 ||
                  local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_218.super_TPZVec<double>.fStore[1] =
                   ABS(-*local_348.fElem *
                       local_348.fElem
                       [local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] +
                       local_348.fElem
                       [local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] *
                       local_348.fElem[1]);
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1 ||
                  local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_218.super_TPZVec<double>.fStore[2] =
                   ABS(*local_348.fElem *
                       local_348.fElem
                       [(long)(local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1)] -
                       local_348.fElem[local_348.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] *
                       local_348.fElem[1]);
              lVar7 = 0;
              iVar4 = 0;
              dVar12 = 0.0;
              dVar14 = 1.0;
              do {
                dVar13 = local_68.super_TPZVec<double>.fStore[lVar7];
                dVar15 = dVar13;
                if (dVar14 <= dVar13) {
                  dVar15 = dVar14;
                }
                if (dVar13 <= dVar12) {
                  dVar13 = dVar12;
                }
                iVar4 = iVar4 + (uint)(1e-06 < local_218.super_TPZVec<double>.fStore[lVar7]);
                lVar7 = lVar7 + 1;
                dVar12 = dVar13;
                dVar14 = dVar15;
              } while (lVar7 != 3);
              if (iVar4 != 1) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAcademicGeoMesh.cpp"
                           ,0x1ba);
              }
              if ((1e-06 < dVar15) && (dVar13 < 0.999999)) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAcademicGeoMesh.cpp"
                           ,0x1bd);
              }
              TPZManVector<double,_3>::~TPZManVector(&local_218);
              TPZManVector<double,_3>::~TPZManVector(&local_68);
              TPZFMatrix<double>::~TPZFMatrix(&local_1d8,&PTR_PTR_01878f38);
              TPZFMatrix<double>::~TPZFMatrix(&local_120,&PTR_PTR_01878f38);
              TPZFMatrix<double>::~TPZFMatrix(&local_348,local_380);
              pTVar11 = local_220;
              if (local_378.fStore != adStack_358) {
                local_378.fNAlloc = 0;
                local_378._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
                if (local_378.fStore != (double *)0x0) {
                  operator_delete__(local_378.fStore);
                  pTVar11 = local_220;
                }
              }
            }
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar3);
      }
      local_278 = local_278 + 1;
    } while (local_278 != local_280);
  }
  return;
}

Assistant:

void TPZAcademicGeoMesh::CheckConsistency(TPZGeoMesh *mesh)
{
    int64_t nel = mesh->NElements();
    for(int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = mesh->ElementVec()[el];
        int nsides = gel->NSides();
        for(int is=0; is<nsides; is++) {
            TPZGeoElSide gelside(gel,is);
            if(gelside.Dimension() != 2) {
                continue;
            }
            if(gelside.Neighbour() != gelside) {
                continue;
            }
            TPZManVector<REAL,2> xi(2,0.);
            gelside.CenterPoint(xi);
            TPZFNMatrix<6,REAL> axes(2,3);
            TPZFNMatrix<4,REAL> jac(2,2),jacinv(2,2);
            REAL detjac;
            gelside.Jacobian(xi, jac, axes, detjac, jacinv);
            TPZManVector<REAL,3> x(3,0.);
            gelside.X(xi, x);
            TPZManVector<REAL,3> normal(3);
            normal[0] = fabs(axes(0,1)*axes(1,2)-axes(0,2)*axes(1,1));
            normal[1] = fabs(-axes(0,0)*axes(1,2)+axes(0,2)*axes(1,0));
            normal[2] = fabs(axes(0,0)*axes(1,1)-axes(0,1)*axes(1,0));
            REAL tol = 1.e-6;
            REAL xmin = 1., xmax = 0.;
            int numtol = 0;
            for(int i=0; i<3; i++) {
                if(xmin > x[i]) xmin = x[i];
                if(xmax < x[i]) {
                    xmax = x[i];
                }
                if(normal[i] > tol) {
                    numtol++;
                }
            }
            if(numtol != 1) {
                DebugStop();
            }
            if(xmin > tol && xmax < 1.-tol) {
                DebugStop();
            }
        }
    }
}